

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.hpp
# Opt level: O2

Interval * __thiscall tcu::Interval::operator&(Interval *this,Interval *other)

{
  double dVar1;
  double dVar2;
  undefined1 uVar3;
  Interval *in_RDI;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = false;
  if (this->m_hasNaN != false) {
    uVar3 = (undefined1)*(undefined4 *)other;
  }
  in_RDI->m_hasNaN = (bool)uVar3;
  dVar1 = this->m_hi;
  dVar2 = other->m_hi;
  uVar4 = -(ulong)(other->m_lo <= this->m_lo);
  uVar5 = -(ulong)(dVar1 <= dVar2);
  in_RDI->m_lo = (double)(~uVar4 & (ulong)other->m_lo | (ulong)this->m_lo & uVar4);
  in_RDI->m_hi = (double)(~uVar5 & (ulong)dVar2 | (ulong)dVar1 & uVar5);
  return in_RDI;
}

Assistant:

Interval	operator&		(const Interval& other) const
	{
		return Interval(m_hasNaN && other.m_hasNaN,
						de::max(m_lo, other.m_lo),
						de::min(m_hi, other.m_hi));
	}